

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

parser_error parse_summon_message_type(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *name;
  char *type;
  wchar_t msg_index;
  summon *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    name = parser_getsym(p,"type");
    iVar1 = message_lookup_by_name(name);
    if (iVar1 < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
    }
    else {
      *(int *)((long)pvVar2 + 0x10) = iVar1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-summon.c"
                ,0x4d,"enum parser_error parse_summon_message_type(struct parser *)");
}

Assistant:

static enum parser_error parse_summon_message_type(struct parser *p) {
	struct summon *s = parser_priv(p);
	int msg_index;
	const char *type;
	assert(s);
	type = parser_getsym(p, "type");
	msg_index = message_lookup_by_name(type);

	if (msg_index < 0)
		return PARSE_ERROR_INVALID_MESSAGE;

	s->message_type = msg_index;
	return PARSE_ERROR_NONE;
}